

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O1

Error * __thiscall
ot::commissioner::Interpreter::UpdateNetworkSelectionInfo
          (Error *__return_storage_ptr__,Interpreter *this,bool onStart)

{
  char *pcVar1;
  Status SVar2;
  char *pcVar3;
  char *pcVar4;
  undefined1 *puVar5;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  bool bVar6;
  string_view fmt;
  format_args args;
  format_args args_00;
  writer write;
  Network nwk;
  string local_110;
  undefined1 local_f0 [8];
  undefined1 *local_e8;
  undefined1 local_e0 [8];
  undefined1 local_d8 [16];
  Network local_c8;
  type local_68 [2];
  char *pcStack_60;
  pointer local_58;
  size_type sStack_50;
  type local_48 [2];
  parse_func local_40;
  code *local_38;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  persistent_storage::Network::Network(&local_c8);
  SVar2 = persistent_storage::Registry::GetCurrentNetwork
                    ((this->mRegistry).
                     super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr,&local_c8);
  if (SVar2 == kSuccess) {
    if ((!onStart) || (local_c8.mXpan == 0)) goto LAB_0024fd32;
    local_68[0] = string_type;
    local_68[1] = string_type;
    pcVar4 = "Network selection recalled from previous session.\nRestored to [{}:\'{}\']";
    pcStack_60 = "Network selection recalled from previous session.\nRestored to [{}:\'{}\']";
    local_58 = (pointer)0x47;
    sStack_50 = 0x200000000;
    local_40 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_38 = ::fmt::v10::detail::
               parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
    ;
    local_110._M_dataplus._M_p = (pointer)local_68;
    local_48 = (type  [2])local_68;
    do {
      if (pcVar4 == "") break;
      pcVar3 = pcVar4;
      if (*pcVar4 == '{') {
LAB_0024fe2a:
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_110,pcVar4,pcVar3);
        pcVar4 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                           (pcVar3,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_68);
        bVar6 = true;
      }
      else {
        pcVar3 = pcVar4 + 1;
        bVar6 = pcVar3 != "";
        if (bVar6) {
          if (*pcVar3 != '{') {
            pcVar1 = pcVar4 + 2;
            do {
              pcVar3 = pcVar1;
              bVar6 = pcVar3 != "";
              if (pcVar3 == "") goto LAB_0024fe26;
              pcVar1 = pcVar3 + 1;
            } while (*pcVar3 != '{');
          }
          bVar6 = true;
        }
LAB_0024fe26:
        if (bVar6) goto LAB_0024fe2a;
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&local_110,pcVar4,"");
        bVar6 = false;
      }
    } while (bVar6);
    utils::Hex<unsigned_long>(&local_110,local_c8.mXpan);
    local_68 = (type  [2])local_110._M_dataplus._M_p;
    pcStack_60 = (char *)local_110._M_string_length;
    local_58 = local_c8.mName._M_dataplus._M_p;
    sStack_50 = local_c8.mName._M_string_length;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x47;
    args_00.field_1.args_ = in_R9.args_;
    args_00.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_
              ((string *)local_f0,
               (v10 *)"Network selection recalled from previous session.\nRestored to [{}:\'{}\']",
               fmt,args_00);
    Console::Write((string *)local_f0,kGreen);
    puVar5 = (undefined1 *)CONCAT44(local_f0._4_4_,local_f0._0_4_);
    if (puVar5 != local_e0) goto LAB_0024fd1a;
  }
  else {
    local_68 = (type  [2])((ulong)local_68 & 0xffffffff00000000);
    pcStack_60 = "getting current network failed";
    local_58 = (pointer)0x1e;
    sStack_50 = 0;
    local_40 = (parse_func)0x0;
    pcVar4 = "getting current network failed";
    local_48 = (type  [2])local_68;
    do {
      pcVar3 = pcVar4 + 1;
      if (*pcVar4 == '}') {
        if ((pcVar3 == "") || (*pcVar3 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar3 = pcVar4 + 2;
      }
      else if (*pcVar4 == '{') {
        pcVar3 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char>&>
                           (pcVar4,"",(format_string_checker<char> *)local_68);
      }
      pcVar4 = pcVar3;
    } while (pcVar3 != "");
    args.field_1.args_ = in_R9.args_;
    args.desc_ = (unsigned_long_long)local_68;
    ::fmt::v10::vformat_abi_cxx11_
              (&local_110,(v10 *)"getting current network failed",(string_view)ZEXT816(0x1e),args);
    local_f0._0_4_ = kRegistryError;
    local_e8 = local_d8;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_e8,local_110._M_dataplus._M_p,
               (char *)(local_110._M_string_length + (long)local_110._M_dataplus._M_p));
    __return_storage_ptr__->mCode = local_f0._0_4_;
    std::__cxx11::string::operator=((string *)&__return_storage_ptr__->mMessage,(string *)&local_e8)
    ;
    puVar5 = local_e8;
    if (local_e8 != local_d8) {
LAB_0024fd1a:
      operator_delete(puVar5);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
LAB_0024fd32:
  Console::SetPrompt(&local_c8.mName);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.mMlp._M_dataplus._M_p != &local_c8.mMlp.field_2) {
    operator_delete(local_c8.mMlp._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8.mName._M_dataplus._M_p != &local_c8.mName.field_2) {
    operator_delete(local_c8.mName._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

Error Interpreter::UpdateNetworkSelectionInfo(bool onStart /*=false*/)
{
    Error   error;
    Network nwk;

    VerifyOrExit(mRegistry->GetCurrentNetwork(nwk) == Registry::Status::kSuccess,
                 error = ERROR_REGISTRY_ERROR(RUNTIME_CUR_NETWORK_FAILED));
    if (onStart && nwk.mXpan != 0)
    {
        Console::Write(fmt::format(FMT_STRING("Network selection recalled from previous session.\n"
                                              "Restored to [{}:'{}']"),
                                   utils::Hex(nwk.mXpan), nwk.mName),
                       Console::Color::kGreen);
    }
exit:
    Console::SetPrompt(nwk.mName);
    return error;
}